

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_remove_front(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  ulong uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> local_68;
  circular_view<int,_18446744073709551615UL> *local_50;
  size_type sStack_48;
  int local_40 [2];
  type local_38 [4];
  circular_view<int,_18446744073709551615UL> local_28;
  
  local_28.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.member.cap = 4;
  local_28.member.size = 0;
  local_28.member.next = 4;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&local_68;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_28,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_28,1);
  local_40[0] = 0x16;
  local_40[1] = 0x21;
  __l._M_len = 2;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,&local_69);
  uVar1 = local_28.member.cap * 2;
  if ((uVar1 & local_28.member.cap * 2 - 1) == 0) {
    uVar2 = local_28.member.next - local_28.member.size & uVar1 - 1;
    sStack_48 = uVar1 - 1 & local_28.member.next;
  }
  else {
    uVar2 = (local_28.member.next - local_28.member.size) % uVar1;
    sStack_48 = local_28.member.next % uVar1;
  }
  second_end._M_current._4_4_ =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current = sStack_48;
  first_end.parent = &local_28;
  first_begin.current = uVar2;
  first_begin.parent = &local_28;
  local_50 = &local_28;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x1a1,"void api_dynamic_suite::dynamic_remove_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_remove_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33 };
    span.remove_front();
    {
        std::vector<int> expect = { 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}